

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

int mbedtls_des3_crypt_cbc
              (mbedtls_des3_context *ctx,int mode,size_t length,uchar *iv,uchar *input,uchar *output
              )

{
  undefined8 uVar1;
  uchar temp [8];
  int i;
  uchar *output_local;
  uchar *input_local;
  uchar *iv_local;
  size_t length_local;
  int mode_local;
  mbedtls_des3_context *ctx_local;
  
  if ((length & 7) == 0) {
    unique0x1000006a = output;
    output_local = input;
    iv_local = (uchar *)length;
    if (mode == 1) {
      for (; iv_local != (uchar *)0x0; iv_local = iv_local + -8) {
        temp[0] = '\0';
        temp[1] = '\0';
        temp[2] = '\0';
        temp[3] = '\0';
        for (; (int)temp._0_4_ < 8; temp._0_4_ = temp._0_4_ + 1) {
          stack0xffffffffffffffc0[(int)temp._0_4_] =
               output_local[(int)temp._0_4_] ^ iv[(int)temp._0_4_];
        }
        mbedtls_des3_crypt_ecb(ctx,stack0xffffffffffffffc0,stack0xffffffffffffffc0);
        *(undefined8 *)iv = *(undefined8 *)stack0xffffffffffffffc0;
        output_local = output_local + 8;
        register0x00000000 = stack0xffffffffffffffc0 + 8;
      }
    }
    else {
      for (; iv_local != (uchar *)0x0; iv_local = iv_local + -8) {
        uVar1 = *(undefined8 *)output_local;
        mbedtls_des3_crypt_ecb(ctx,output_local,stack0xffffffffffffffc0);
        temp[0] = '\0';
        temp[1] = '\0';
        temp[2] = '\0';
        temp[3] = '\0';
        for (; (int)temp._0_4_ < 8; temp._0_4_ = temp._0_4_ + 1) {
          stack0xffffffffffffffc0[(int)temp._0_4_] =
               stack0xffffffffffffffc0[(int)temp._0_4_] ^ iv[(int)temp._0_4_];
        }
        *(undefined8 *)iv = uVar1;
        output_local = output_local + 8;
        register0x00000000 = stack0xffffffffffffffc0 + 8;
      }
    }
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = -0x32;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_des3_crypt_cbc( mbedtls_des3_context *ctx,
                     int mode,
                     size_t length,
                     unsigned char iv[8],
                     const unsigned char *input,
                     unsigned char *output )
{
    int i;
    unsigned char temp[8];

    if( length % 8 )
        return( MBEDTLS_ERR_DES_INVALID_INPUT_LENGTH );

    if( mode == MBEDTLS_DES_ENCRYPT )
    {
        while( length > 0 )
        {
            for( i = 0; i < 8; i++ )
                output[i] = (unsigned char)( input[i] ^ iv[i] );

            mbedtls_des3_crypt_ecb( ctx, output, output );
            memcpy( iv, output, 8 );

            input  += 8;
            output += 8;
            length -= 8;
        }
    }
    else /* MBEDTLS_DES_DECRYPT */
    {
        while( length > 0 )
        {
            memcpy( temp, input, 8 );
            mbedtls_des3_crypt_ecb( ctx, input, output );

            for( i = 0; i < 8; i++ )
                output[i] = (unsigned char)( output[i] ^ iv[i] );

            memcpy( iv, temp, 8 );

            input  += 8;
            output += 8;
            length -= 8;
        }
    }

    return( 0 );
}